

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::TextureCubeShader::shadeFragments
          (TextureCubeShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  int fragNdx_1;
  uint uVar4;
  float *pfVar5;
  FragmentPacket *packet;
  Vec4 *output;
  long lVar6;
  int fragNdx;
  uint uVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 texBias;
  Vec4 texScale;
  Vec3 texCoords [4];
  Vec4 colors [4];
  deUint32 local_120;
  deUint32 dStack_11c;
  float local_118;
  deUint32 local_114;
  ulong local_110;
  TextureCubeShader *local_108;
  FragmentPacket *local_100;
  ulong local_f8;
  TextureCube *local_f0;
  deUint32 local_e8;
  deUint32 dStack_e4;
  deUint32 dStack_e0;
  deUint32 dStack_dc;
  deUint32 local_d8;
  deUint32 dStack_d4;
  deUint32 dStack_d0;
  deUint32 dStack_cc;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vec3 local_a8 [4];
  Vec4 local_78 [4];
  
  local_100 = packets;
  tcu::Vector<float,_4>::Vector
            (&local_b8,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[2].value);
  local_108 = this;
  tcu::Vector<float,_4>::Vector
            (&local_c8,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[3].value);
  lVar6 = 0;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)local_a8[0].m_data + lVar6));
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x30);
  lVar6 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_78[0].m_data + lVar6));
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  local_110 = 0;
  local_f8 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_f8 = local_110;
  }
  do {
    if (local_110 == local_f8) {
      return;
    }
    local_f0 = (local_108->super_ShaderProgram).m_uniforms.
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start[1].sampler.texCube;
    packet = local_100 + local_110;
    pfVar5 = local_a8[0].m_data + 2;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_120,packet,context,0,(int)lVar6);
      *(ulong *)((Vec3 *)(pfVar5 + -2))->m_data = CONCAT44(dStack_11c,local_120);
      *pfVar5 = local_118;
      pfVar5 = pfVar5 + 3;
    }
    output = local_78;
    sglr::rc::TextureCube::sample4(local_f0,output,local_a8,0.0);
    uVar7 = (int)local_110 * 4;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      tcu::operator*((tcu *)&local_d8,output,&local_b8);
      tcu::operator+((tcu *)&local_120,(Vector<float,_4> *)&local_d8,&local_c8);
      castVectorSaturate<int>((Vec4 *)&local_120);
      castVectorSaturate<unsigned_int>((Vec4 *)&local_120);
      DVar1 = local_108->m_outputType;
      uVar4 = (uint)lVar6;
      if (DVar1 == TYPE_UINT_VEC4) {
        pGVar2 = context->outputArray;
        iVar3 = (uVar4 | uVar7) * context->numFragmentOutputs;
        dVar8 = local_e8;
        dVar9 = dStack_e4;
        dVar10 = dStack_e0;
        dVar11 = dStack_dc;
LAB_0112e086:
        pGVar2 = pGVar2 + iVar3;
        (pGVar2->v).uData[0] = dVar8;
        (pGVar2->v).uData[1] = dVar9;
        (pGVar2->v).uData[2] = dVar10;
        (pGVar2->v).uData[3] = dVar11;
      }
      else {
        if (DVar1 == TYPE_INT_VEC4) {
          pGVar2 = context->outputArray;
          iVar3 = (uVar4 | uVar7) * context->numFragmentOutputs;
          dVar8 = local_d8;
          dVar9 = dStack_d4;
          dVar10 = dStack_d0;
          dVar11 = dStack_cc;
          goto LAB_0112e086;
        }
        if (DVar1 == TYPE_FLOAT_VEC4) {
          pGVar2 = context->outputArray;
          iVar3 = (uVar4 | uVar7) * context->numFragmentOutputs;
          pGVar2[iVar3].v.uData[0] = local_120;
          pGVar2[iVar3].v.uData[1] = dStack_11c;
          pGVar2[iVar3].v.uData[2] = (deUint32)local_118;
          pGVar2[iVar3].v.uData[3] = local_114;
        }
      }
      output = output + 1;
    }
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

void TextureCubeShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale (m_uniforms[2].value.f4);
	const tcu::Vec4 texBias	 (m_uniforms[3].value.f4);

	tcu::Vec3 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::TextureCube* tex = m_uniforms[1].sampler.texCube;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec3(coord.x(), coord.y(), coord.z());
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}